

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorStraightGradientInstancer::DecoratorStraightGradientInstancer
          (DecoratorStraightGradientInstancer *this)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_249;
  String local_248;
  allocator<char> local_221;
  String local_220;
  allocator<char> local_1f9;
  String local_1f8;
  allocator<char> local_1d1;
  String local_1d0;
  allocator<char> local_1a9;
  String local_1a8;
  allocator<char> local_181;
  String local_180;
  allocator<char> local_159;
  String local_158;
  allocator<char> local_131;
  String local_130;
  allocator<char> local_109;
  String local_108;
  allocator<char> local_e1;
  String local_e0;
  allocator<char> local_b9;
  String local_b8;
  allocator<char> local_91;
  String local_90;
  allocator<char> local_69;
  String local_68;
  allocator<char> local_31;
  String local_30;
  DecoratorStraightGradientInstancer *local_10;
  DecoratorStraightGradientInstancer *this_local;
  
  local_10 = this;
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorStraightGradientInstancer_00815960;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"direction",&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"horizontal",&local_69);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_30,
                      &local_68);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"keyword",&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"horizontal, vertical",&local_b9);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_90,&local_b8);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).direction = PVar1;
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"start-color",&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"#ffffff",&local_109);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_e0,
                      &local_108);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"color",&local_131);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_130,&local_158);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).start = PVar1;
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::allocator<char>::~allocator(&local_159);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::allocator<char>::~allocator(&local_131);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::allocator<char>::~allocator(&local_109);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"stop-color",&local_181)
  ;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"#ffffff",&local_1a9);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_180,
                      &local_1a8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"color",&local_1d1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_1d0,&local_1f8);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).stop = PVar1;
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::allocator<char>::~allocator(&local_1f9);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::allocator<char>::~allocator(&local_1d1);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::allocator<char>::~allocator(&local_1a9);
  ::std::__cxx11::string::~string((string *)&local_180);
  ::std::allocator<char>::~allocator(&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"decorator",&local_221);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"direction, start-color, stop-color",&local_249);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_220,&local_248,
             FallThrough);
  ::std::__cxx11::string::~string((string *)&local_248);
  ::std::allocator<char>::~allocator(&local_249);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::allocator<char>::~allocator(&local_221);
  return;
}

Assistant:

DecoratorStraightGradientInstancer::DecoratorStraightGradientInstancer()
{
	ids.direction = RegisterProperty("direction", "horizontal").AddParser("keyword", "horizontal, vertical").GetId();
	ids.start = RegisterProperty("start-color", "#ffffff").AddParser("color").GetId();
	ids.stop = RegisterProperty("stop-color", "#ffffff").AddParser("color").GetId();
	RegisterShorthand("decorator", "direction, start-color, stop-color", ShorthandType::FallThrough);
}